

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rg_demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar2;
  pointer pRVar3;
  Scalar *pSVar4;
  ostream *poVar5;
  __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
  local_248;
  __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
  local_240;
  iterator it;
  RGRegion region;
  Scalar local_200;
  RGOptions options;
  Scalar local_1f8;
  Matrix<int,_3,_1,_0,_3,_1> local_1f4;
  undefined1 local_1e8 [8];
  RGProblem subproblem;
  Scalar local_1b4;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_1b0;
  Scalar local_190;
  Scalar local_18c;
  int j_5;
  int i_5;
  Scalar local_17c;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_178;
  Scalar local_158;
  Scalar local_154;
  int j_4;
  int i_4;
  Scalar local_144;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_140;
  Scalar local_120;
  Scalar local_11c;
  int j_3;
  int i_3;
  Scalar local_10c;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_108;
  Scalar local_e8;
  Scalar local_e4;
  int j_2;
  int i_2;
  Scalar local_d4;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_d0;
  Scalar local_b0;
  Scalar local_ac;
  int j_1;
  int i_1;
  Scalar local_9c;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_98;
  Scalar local_78;
  Scalar local_74;
  int j;
  int i;
  Vector3i obs;
  Scalar local_58 [3];
  Matrix<int,_3,_1,_0,_3,_1> local_4c;
  undefined1 local_40 [8];
  RGProblem problem;
  char **argv_local;
  int argc_local;
  
  problem._32_8_ = argv;
  rg::RGProblem::RGProblem((RGProblem *)local_40);
  local_58[2] = 3;
  local_58[1] = 3;
  local_58[0] = 3;
  Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix(&local_4c,local_58 + 2,local_58 + 1,local_58);
  rg::RGProblem::setSeedPoint(local_40,&local_4c);
  Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix((Matrix<int,_3,_1,_0,_3,_1> *)&j);
  for (local_74 = 1; local_74 < 4; local_74 = local_74 + 1) {
    for (local_78 = 1; local_78 < 4; local_78 = local_78 + 1) {
      local_9c = 0;
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_98,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_9c);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_98,&local_74);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_78);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_98);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)&j_1,(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle(local_40,&j_1);
    }
  }
  for (local_ac = 1; local_ac < 4; local_ac = local_ac + 1) {
    for (local_b0 = 1; local_b0 < 4; local_b0 = local_b0 + 1) {
      local_d4 = 5;
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_d0,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_d4);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_d0,&local_ac);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_b0);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_d0);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)&j_2,(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle(local_40,&j_2);
    }
  }
  for (local_e4 = 1; local_e4 < 4; local_e4 = local_e4 + 1) {
    for (local_e8 = 1; local_e8 < 4; local_e8 = local_e8 + 1) {
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_108,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_e4);
      local_10c = 0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_108,&local_10c);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_e8);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_108);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)&j_3,(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle(local_40,&j_3);
    }
  }
  for (local_11c = 1; local_11c < 4; local_11c = local_11c + 1) {
    for (local_120 = 1; local_120 < 4; local_120 = local_120 + 1) {
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_140,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_11c);
      local_144 = 5;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_140,&local_144);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_120);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_140);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)&j_4,(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle(local_40,&j_4);
    }
  }
  for (local_154 = 1; local_154 < 4; local_154 = local_154 + 1) {
    for (local_158 = 1; local_158 < 4; local_158 = local_158 + 1) {
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_178,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_154);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_178,&local_158);
      local_17c = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_17c);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_178);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)&j_5,(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle(local_40,&j_5);
    }
  }
  for (local_18c = 1; local_18c < 4; local_18c = local_18c + 1) {
    for (local_190 = 1; local_190 < 4; local_190 = local_190 + 1) {
      Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
                (&local_1b0,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&j,&local_18c);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         (&local_1b0,&local_190);
      local_1b4 = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_1b4);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_1b0);
      Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<int,_3,_1,_0,_3,_1> *)
                 (subproblem.seed.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),(Matrix<int,_3,_1,_0,_3,_1> *)&j);
      rg::RGProblem::addObstacle
                (local_40,subproblem.seed.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2);
    }
  }
  rg::RGProblem::RGProblem((RGProblem *)local_1e8);
  local_1f8 = 3;
  options.iter_limit = 3;
  local_200 = 3;
  Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix(&local_1f4,&local_1f8,&options.iter_limit,&local_200);
  rg::RGProblem::getSubproblem(local_40,(int)&local_1f4,(RGProblem *)0xa);
  rg::RGOptions::RGOptions
            ((RGOptions *)
             ((long)&region.inner_pts.
                     super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  region.inner_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 100;
  rg::inflate_region((RGProblem *)&it,(RGOptions *)local_40);
  local_240._M_current =
       (RGPoint *)
       std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>::begin
                 ((vector<rg::RGPoint,_std::allocator<rg::RGPoint>_> *)&it);
  while( true ) {
    local_248._M_current =
         (RGPoint *)
         std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>::end
                   ((vector<rg::RGPoint,_std::allocator<rg::RGPoint>_> *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_240,&local_248);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_240);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)pRVar3);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pSVar4);
    poVar5 = std::operator<<(poVar5,",");
    pRVar3 = __gnu_cxx::
             __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_240);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)pRVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pSVar4);
    poVar5 = std::operator<<(poVar5,",");
    pRVar3 = __gnu_cxx::
             __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_240);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::z
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)pRVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pSVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>::
    operator++(&local_240);
  }
  rg::RGRegion::~RGRegion((RGRegion *)&it);
  rg::RGProblem::~RGProblem((RGProblem *)local_1e8);
  rg::RGProblem::~RGProblem((RGProblem *)local_40);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  //test_is_required_point();
  
  
  rg::RGProblem problem;

  problem.setSeedPoint(Eigen::Vector3i(3, 3, 3));

  Eigen::Vector3i obs;

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 0, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 5, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 0, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 5, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  rg::RGProblem subproblem;
  problem.getSubproblem(Eigen::Vector3i(3, 3, 3), 10, &subproblem);
  //Eigen::Vector3i point = subproblem.getSeed();
  //std::cout << "sssss: " << point.x() << " " << point.y() << " " << point.z() << std::endl;
  //std::vector<Eigen::Vector3i> obstacles = problem.getObstacles();

  //for (auto it = obstacles.begin(); it != obstacles.end(); ++it)
  //{
  //  std::cout << it->x() << "," << it->y() << "," << it->z() << std::endl;
  //}

  rg::RGOptions options;

  options.iter_limit = 100;

  rg::RGRegion region = inflate_region(problem, options);

  for (auto it = region.region_bound_pts.begin(); it != region.region_bound_pts.end(); ++it)
  {
    std::cout << it->point.x() << "," << it->point.y() << "," << it->point.z() << std::endl;
  }



  return 0;
}